

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdUVTexture *shader,uint32_t indent)

{
  anon_struct_8_0_00000001_for___align aVar1;
  undefined8 uVar2;
  uint32_t indent_00;
  uint32_t in_R8D;
  stringstream ss;
  undefined1 local_200 [32];
  undefined1 local_1e0 [40];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0._32_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:file","");
  indent_00 = (uint32_t)shader;
  print_typed_attr<tinyusdz::value::AssetPath>
            ((string *)local_1e0,
             (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)(this + 0x730),
             (string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  aVar1 = (anon_struct_8_0_00000001_for___align)((long)local_1e0 + 0x10);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"inputs:sourceColorSpace","");
  print_typed_token_attr<tinyusdz::UsdUVTexture::SourceColorSpace>
            ((string *)local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
              *)(this + 0x13c8),(string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:fallback","");
  print_typed_attr<tinyusdz::value::color4f>
            ((string *)local_1e0,
             (TypedAttributeWithFallback<tinyusdz::value::color4f> *)(this + 0x1178),
             (string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:bias","");
  print_typed_attr<std::array<float,4ul>>
            ((string *)local_1e0,this + 0x18a0,
             (TypedAttributeWithFallback<std::array<float,_4UL>_> *)local_200,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:scale","");
  print_typed_attr<std::array<float,4ul>>
            ((string *)local_1e0,this + 0x1650,
             (TypedAttributeWithFallback<std::array<float,_4UL>_> *)local_200,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:st","");
  print_typed_attr<tinyusdz::value::texcoord2f>
            ((string *)local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)
             (this + 0x9d0),(string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:wrapT","");
  print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>
            ((string *)local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
             (this + 0xc68),(string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"inputs:wrapS","");
  print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>
            ((string *)local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
             (this + 0xef0),(string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"outputs:r","");
  print_typed_terminal_attr<float>
            ((string *)local_1e0,(TypedTerminalAttribute<float> *)(this + 0x1af0),
             (string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"outputs:g","");
  print_typed_terminal_attr<float>
            ((string *)local_1e0,(TypedTerminalAttribute<float> *)(this + 0x1d20),
             (string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"outputs:b","");
  print_typed_terminal_attr<float>
            ((string *)local_1e0,(TypedTerminalAttribute<float> *)(this + 0x1f50),
             (string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"outputs:a","");
  print_typed_terminal_attr<float>
            ((string *)local_1e0,(TypedTerminalAttribute<float> *)(this + 0x2180),
             (string *)local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = (long)local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"outputs:rgb","");
  print_typed_terminal_attr<std::array<float,3ul>>
            ((string *)local_1e0,this + 0x23b0,
             (TypedTerminalAttribute<std::array<float,_3UL>_> *)local_200,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (local_200._0_8_ != (long)local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  print_common_shader_params_abi_cxx11_
            ((string *)local_1e0,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_1e0._0_8_,local_1e0._8_8_);
  if ((anon_struct_8_0_00000001_for___align)local_1e0._0_8_ != aVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  uVar2 = local_1e0._32_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return (string *)uVar2;
}

Assistant:

static std::string print_shader_params(const UsdUVTexture &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.file, "inputs:file", indent);

  ss << print_typed_token_attr(shader.sourceColorSpace,
                               "inputs:sourceColorSpace", indent);

  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);

  ss << print_typed_attr(shader.bias, "inputs:bias", indent);
  ss << print_typed_attr(shader.scale, "inputs:scale", indent);

  ss << print_typed_attr(shader.st, "inputs:st", indent);
  ss << print_typed_token_attr(shader.wrapS, "inputs:wrapT", indent);
  ss << print_typed_token_attr(shader.wrapT, "inputs:wrapS", indent);

  ss << print_typed_terminal_attr(shader.outputsR, "outputs:r", indent);
  ss << print_typed_terminal_attr(shader.outputsG, "outputs:g", indent);
  ss << print_typed_terminal_attr(shader.outputsB, "outputs:b", indent);
  ss << print_typed_terminal_attr(shader.outputsA, "outputs:a", indent);
  ss << print_typed_terminal_attr(shader.outputsRGB, "outputs:rgb", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}